

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14803::TestCheckArrayCloseTrue::RunImpl(TestCheckArrayCloseTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  float array2 [3];
  float array1 [3];
  TestResults results;
  float local_88;
  int local_84;
  TestDetails local_80;
  float local_60 [4];
  float local_50 [4];
  TestResults local_40;
  
  UnitTest::TestResults::TestResults(&local_40,(TestReporter *)0x0);
  local_50[0] = 1.0;
  local_50[1] = 1.5;
  local_50[2] = 2.0;
  local_60[0] = 1.01;
  local_60[1] = 1.51;
  local_60[2] = 2.01;
  local_88 = 0.02;
  UnitTest::TestDetails::TestDetails(&local_80,"","","",0);
  UnitTest::CheckArrayClose<float[3],float[3],float>
            (&local_40,(float (*) [3])local_50,(float (*) [3])local_60,3,&local_88,&local_80);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_88 = 0.0;
  local_84 = UnitTest::TestResults::GetFailureCount(&local_40);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_80,*ppTVar2,0xd2);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_88,&local_84,&local_80);
  return;
}

Assistant:

TEST(CheckArrayCloseTrue)
{
    TestResults results;

    float const array1[3] = { 1.0f, 1.5f, 2.0f };
    float const array2[3] = { 1.01f, 1.51f, 2.01f };
    CheckArrayClose(results, array1, array2, 3, 0.02f, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}